

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall
wabt::ImportMixin<(wabt::ExternalKind)0>::ImportMixin(ImportMixin<(wabt::ExternalKind)0> *this)

{
  ImportMixin<(wabt::ExternalKind)0> *this_local;
  
  Import::Import(&this->super_Import,First);
  (this->super_Import)._vptr_Import = (_func_int **)&PTR__ImportMixin_01e533a8;
  return;
}

Assistant:

ImportMixin() : Import(TypeEnum) {}